

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void console_message_float(char *mes,double num)

{
  char *in_RDI;
  undefined8 in_XMM0_Qa;
  
  fprintf(_stderr,in_RDI,in_XMM0_Qa);
  return;
}

Assistant:

void console_message_float(const char *mes, double num)
{
#if defined(_WIN32)
	char *temp = u8tosjis(mes);
	if (temp == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return;
	}
	fprintf(stderr, temp, num);
	free(temp);
#else
	fprintf(stderr, mes, num);
#endif
}